

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_avx2.c
# Opt level: O2

void highbd_calc16x16var_avx2
               (uint16_t *src,int src_stride,uint16_t *ref,int ref_stride,uint32_t *sse,int *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [32];
  
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  auVar7 = ZEXT1664((undefined1  [16])0x0);
  iVar4 = 0x10;
  while( true ) {
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    auVar6 = auVar7._0_32_;
    if (bVar5) break;
    auVar9 = vpsubw_avx2(*(undefined1 (*) [32])src,*(undefined1 (*) [32])ref);
    auVar3 = vpmaddwd_avx2(auVar9,auVar9);
    auVar9 = vpaddw_avx2(auVar9,auVar8._0_32_);
    auVar8 = ZEXT3264(auVar9);
    auVar6 = vpaddd_avx2(auVar3,auVar6);
    auVar7 = ZEXT3264(auVar6);
    ref = (uint16_t *)(*(undefined1 (*) [32])ref + (long)ref_stride * 2);
    src = (uint16_t *)(*(undefined1 (*) [32])src + (long)src_stride * 2);
  }
  auVar9._8_2_ = 1;
  auVar9._0_8_ = 0x1000100010001;
  auVar9._10_2_ = 1;
  auVar9._12_2_ = 1;
  auVar9._14_2_ = 1;
  auVar9._16_2_ = 1;
  auVar9._18_2_ = 1;
  auVar9._20_2_ = 1;
  auVar9._22_2_ = 1;
  auVar9._24_2_ = 1;
  auVar9._26_2_ = 1;
  auVar9._28_2_ = 1;
  auVar9._30_2_ = 1;
  auVar9 = vpmaddwd_avx2(auVar8._0_32_,auVar9);
  auVar3 = vpunpckldq_avx2(auVar9,auVar6);
  auVar6 = vpunpckhdq_avx2(auVar9,auVar6);
  auVar6 = vpaddd_avx2(auVar3,auVar6);
  auVar1 = vpaddd_avx(auVar6._0_16_,auVar6._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  *sum = auVar1._0_4_;
  *sse = auVar1._4_4_;
  return;
}

Assistant:

static void highbd_calc16x16var_avx2(const uint16_t *src, int src_stride,
                                     const uint16_t *ref, int ref_stride,
                                     uint32_t *sse, int *sum) {
  __m256i v_sum_d = _mm256_setzero_si256();
  __m256i v_sse_d = _mm256_setzero_si256();
  const __m256i one = _mm256_set1_epi16(1);
  for (int i = 0; i < 16; ++i) {
    const __m256i v_p_a = _mm256_loadu_si256((const __m256i *)src);
    const __m256i v_p_b = _mm256_loadu_si256((const __m256i *)ref);
    const __m256i v_diff = _mm256_sub_epi16(v_p_a, v_p_b);
    const __m256i v_sqrdiff = _mm256_madd_epi16(v_diff, v_diff);
    v_sum_d = _mm256_add_epi16(v_sum_d, v_diff);
    v_sse_d = _mm256_add_epi32(v_sse_d, v_sqrdiff);
    src += src_stride;
    ref += ref_stride;
  }
  __m256i v_sum0 = _mm256_madd_epi16(v_sum_d, one);
  __m256i v_d_l = _mm256_unpacklo_epi32(v_sum0, v_sse_d);
  __m256i v_d_h = _mm256_unpackhi_epi32(v_sum0, v_sse_d);
  __m256i v_d_lh = _mm256_add_epi32(v_d_l, v_d_h);
  const __m128i v_d0_d = _mm256_castsi256_si128(v_d_lh);
  const __m128i v_d1_d = _mm256_extracti128_si256(v_d_lh, 1);
  __m128i v_d = _mm_add_epi32(v_d0_d, v_d1_d);
  v_d = _mm_add_epi32(v_d, _mm_srli_si128(v_d, 8));
  *sum = _mm_extract_epi32(v_d, 0);
  *sse = _mm_extract_epi32(v_d, 1);
}